

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,FieldAccess *field_access)

{
  bool bVar1;
  mapped_type *pmVar2;
  __tuple_element_t<0UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var3;
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var4;
  runtime_error *this_00;
  bool local_f9;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_d0;
  byte local_c2;
  byte local_c1;
  string local_c0;
  Symbol local_a0;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_80;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_78 [3];
  string local_60;
  Symbol local_40;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_20;
  FieldAccess *local_18;
  FieldAccess *field_access_local;
  NewSymbolTreeVisitor *this_local;
  
  local_18 = field_access;
  field_access_local = (FieldAccess *)this;
  pmVar2 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
  p_Var3 = std::
           get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                     (pmVar2);
  std::__cxx11::string::string((string *)&local_60,(string *)&local_18->field_name_);
  local_c1 = 0;
  local_c2 = 0;
  Symbol::Symbol(&local_40,&local_60);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
       ::find(p_Var3,&local_40);
  pmVar2 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
  p_Var3 = std::
           get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                     (pmVar2);
  local_78[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
       ::end(p_Var3);
  bVar1 = std::__detail::operator==(&local_20,local_78);
  local_f9 = false;
  if (bVar1) {
    pmVar2 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var4 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar2);
    std::__cxx11::string::string((string *)&local_c0,(string *)&local_18->field_name_);
    local_c1 = 1;
    Symbol::Symbol(&local_a0,&local_c0);
    local_c2 = 1;
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::find(p_Var4,&local_a0);
    pmVar2 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var4 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar2);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::end(p_Var4);
    local_f9 = std::__detail::operator==(&local_80,&local_d0);
  }
  if ((local_c2 & 1) != 0) {
    Symbol::~Symbol(&local_a0);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  Symbol::~Symbol(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_f9 != false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid field access");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(FieldAccess* field_access) {
  if (std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .find(Symbol(field_access->field_name_)) ==
          std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .end() &&
      std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .find(Symbol(field_access->field_name_)) ==
          std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .end()) {
    throw std::runtime_error("Invalid field access");
  }
}